

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::JSONParser::ParseConstVector(JSONParser *this,ValueTypes *out_types,Values *out_values)

{
  pointer *ppTVar1;
  pointer *ppVVar2;
  pointer pVVar3;
  iterator __position;
  iterator __position_00;
  bool bVar4;
  Result RVar5;
  Enum EVar6;
  TypedValue tv;
  Type local_78;
  anon_union_16_6_113bff37_for_Value_0 local_70;
  ExpectedValue local_60;
  
  pVVar3 = (out_values->
           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out_values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar3) {
    (out_values->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
    _M_impl.super__Vector_impl_data._M_finish = pVVar3;
  }
  RVar5 = Expect(this,"[");
  EVar6 = Error;
  if (RVar5.enum_ != Error) {
    bVar4 = Match(this,"]");
    if (bVar4) {
LAB_0012536a:
      EVar6 = Ok;
    }
    else {
      do {
        local_70.i64_ = 0;
        local_70._8_8_ = 0;
        local_60.value.value.field_0.i64_ = 0;
        local_60.value.value.field_0._8_8_ = 0;
        RVar5 = ParseExpectedValue(this,&local_60,No);
        if (RVar5.enum_ == Error) {
          return (Result)Error;
        }
        local_70._8_8_ = local_60.value.value.field_0._8_8_;
        local_78.enum_ = local_60.value.type.enum_;
        local_78.type_index_ = local_60.value.type.type_index_;
        local_70.i64_ = local_60.value.value.field_0.i64_;
        __position._M_current =
             (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                    ((vector<wabt::Type,std::allocator<wabt::Type>> *)out_types,__position,&local_78
                    );
        }
        else {
          (__position._M_current)->enum_ = local_60.value.type.enum_;
          (__position._M_current)->type_index_ = local_60.value.type.type_index_;
          ppTVar1 = &(out_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
        __position_00._M_current =
             (out_values->
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (out_values->
            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>::
          _M_realloc_insert<wabt::interp::Value_const&>
                    ((vector<wabt::interp::Value,std::allocator<wabt::interp::Value>> *)out_values,
                     __position_00,(Value *)&local_70.v128_);
        }
        else {
          ((__position_00._M_current)->field_0).i64_ = local_70.i64_;
          *(undefined8 *)((long)&(__position_00._M_current)->field_0 + 8) = local_70._8_8_;
          ppVVar2 = &(out_values->
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppVVar2 = *ppVVar2 + 1;
        }
        bVar4 = Match(this,"]");
        if (bVar4) goto LAB_0012536a;
        RVar5 = Expect(this,",");
      } while (RVar5.enum_ != Error);
    }
  }
  return (Result)EVar6;
}

Assistant:

wabt::Result JSONParser::ParseConstVector(ValueTypes* out_types,
                                          Values* out_values) {
  out_values->clear();
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    if (!first) {
      EXPECT(",");
    }
    TypedValue tv;
    CHECK_RESULT(ParseConst(&tv));
    out_types->push_back(tv.type);
    out_values->push_back(tv.value);
    first = false;
  }
  return wabt::Result::Ok;
}